

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall fasttext::Model::computeOutput(Model *this,Vector *hidden,Vector *output)

{
  if ((this->quant_ == true) &&
     (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->qout ==
      true)) {
    Vector::mul(output,(this->qwo_).
                       super___shared_ptr<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                hidden);
    return;
  }
  Vector::mul(output,(this->wo_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,hidden);
  return;
}

Assistant:

void Model::computeOutput(Vector& hidden, Vector& output) const {
	if (quant_ && args_->qout) {
		output.mul(*qwo_, hidden);
	} else {
		output.mul(*wo_, hidden);
	}
}